

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O3

bool __thiscall
ElectricityBill::GetInfoFromUrl(ElectricityBill *this,string *request_url,RoomInfo *room_info)

{
  int iVar1;
  iterator iVar2;
  long lVar3;
  bool bVar4;
  
  if (request_url->_M_string_length - 7 < 2) {
    std::__cxx11::string::push_back((char)room_info);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&name_map_abi_cxx11_._M_t,&room_info->flatname);
    if (((_Rb_tree_header *)iVar2._M_node != &name_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
        ) && (std::__cxx11::string::_M_assign((string *)room_info),
             0xf5 < (byte)((request_url->_M_dataplus)._M_p[2] - 0x3aU))) {
      std::__cxx11::string::push_back((char)room_info);
      std::__cxx11::string::append((char *)room_info);
      if (0xfc < (byte)((request_url->_M_dataplus)._M_p[3] + 0xbcU)) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&room_info->roomname,0,(room_info->roomname)._M_string_length,'\x01');
        if ((int)request_url->_M_string_length < 5) {
          return true;
        }
        lVar3 = 4;
        do {
          bVar4 = (byte)((request_url->_M_dataplus)._M_p[lVar3] - 0x30U) < 10;
          if (!bVar4) {
            return bVar4;
          }
          std::__cxx11::string::push_back((char)&room_info->roomname);
          lVar3 = lVar3 + 1;
          iVar1 = (int)request_url->_M_string_length;
          if (7 < iVar1) {
            iVar1 = 8;
          }
        } while (lVar3 < iVar1);
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

bool ElectricityBill::GetInfoFromUrl(const std::string& request_url, RoomInfo* room_info)
{
	// "/M2A4000"
	if (request_url.length() != 8 && request_url.length() != 7)
	{
		return false;
	}

	room_info->flatname += request_url[1];

	auto find_result = name_map.find(room_info->flatname);
	if (find_result != name_map.end())
	{
		room_info->flatname = find_result->second;
	}
	else
	{
		return false;
	}


	if (request_url[2] < '0' || request_url[2] > '9')
	{
		return false;
	}
	room_info->flatname += request_url[2];
	room_info->flatname += "楼"; // 梅2楼

	if (request_url[3] < 'A' || request_url[3] > 'C')
	{
		return false;
	}

	room_info->roomname = request_url[3];

	//  /M2A4000

	for (int i = 4; i < std::min(8, static_cast<int>(request_url.length())); ++i)
	{
		if (request_url[i] < '0' || request_url[i] > '9')
		{
			return false;
		}
		else
		{
			room_info->roomname += request_url[i];
		}
	}
	return true;
}